

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

LY_ERR lyds_insert2(lyd_node *parent,lyd_node **first_sibling,lyd_node **leader,lyd_node *node,
                   lyds_pool *pool)

{
  lyd_meta *plVar1;
  lyd_node *plVar2;
  lyd_node **first_sibling_00;
  LY_ERR ret__;
  LY_ERR LVar3;
  rb_node *prVar4;
  rb_node *rbn_00;
  lyd_node *plVar5;
  lysc_node *schema;
  lyd_meta *root_meta;
  rb_node *local_60;
  lyd_node **local_58;
  rb_node *rbn;
  lyd_meta *local_48;
  rb_node **local_40;
  lyd_node *ld;
  
  if ((((pool == (lyds_pool *)0x0) || (node == (lyd_node *)0x0)) ||
      (first_sibling == (lyd_node **)0x0)) || (pool->rbn == (rb_node *)0x0)) {
    __assert_fail("pool && pool->rbn && first_sibling && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x4f0,
                  "LY_ERR lyds_insert2(struct lyd_node *, struct lyd_node **, struct lyd_node **, struct lyd_node *, struct lyds_pool *)"
                 );
  }
  plVar5 = *leader;
  local_58 = first_sibling;
  if (plVar5 == (lyd_node *)0x0) {
    schema = node->schema;
LAB_001518a7:
    ld = (lyd_node *)0x0;
    lyd_find_sibling_schema(*first_sibling,schema,&ld);
    if (ld == (lyd_node *)0x0) {
      lyd_insert_node_ordby_schema(parent,first_sibling,node);
      *leader = node;
      goto LAB_001519a3;
    }
    *leader = ld;
    plVar5 = ld;
  }
  else {
    schema = node->schema;
    if (plVar5->schema != schema) goto LAB_001518a7;
  }
  prVar4 = lyds_get_rb_tree(plVar5,&root_meta);
  local_60 = prVar4;
  if (root_meta == (lyd_meta *)0x0) {
    root_meta = pool->meta;
    if (root_meta == (lyd_meta *)0x0) {
      root_meta = (lyd_meta *)0x0;
      LVar3 = lyds_create_metadata(plVar5,&root_meta);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    else {
      plVar1 = root_meta->next;
      root_meta->next = (lyd_meta *)0x0;
      pool->meta = plVar1;
      lyd_insert_meta(*leader,root_meta,'\0');
    }
  }
  rbn_00 = pool->rbn;
  if (prVar4 == (rb_node *)0x0) {
    local_48 = root_meta;
    *(undefined8 *)&rbn_00->color = 0;
    rbn_00->right = (rb_node *)0x0;
    rbn_00->dnode = (lyd_node *)0x0;
    rbn_00->parent = (rb_node *)0x0;
    rbn_00->left = (rb_node *)0x0;
    local_60 = pool->rbn;
    local_60->dnode = *leader;
    local_40 = &pool->iter_state;
    rbn_00 = rb_iter_next(local_40);
    pool->rbn = rbn_00;
    plVar5 = (*leader)->next;
    while( true ) {
      if ((plVar5 == (lyd_node *)0x0) || (plVar5->schema != (*leader)->schema)) goto LAB_00151924;
      if (rbn_00 == (rb_node *)0x0) break;
      plVar2 = plVar5->next;
      *(undefined8 *)&rbn_00->color = 0;
      rbn_00->right = (rb_node *)0x0;
      rbn_00->dnode = (lyd_node *)0x0;
      rbn_00->parent = (rb_node *)0x0;
      rbn_00->left = (rb_node *)0x0;
      prVar4 = pool->rbn;
      prVar4->dnode = plVar5;
      rb_insert_node(&local_60,prVar4,(ly_bool *)&rbn);
      first_sibling_00 = local_58;
      if ((char)rbn == '\0') {
        lyd_unlink_ignore_lyds(local_58,plVar5);
        lyds_link_data_node(first_sibling_00,leader,plVar5,local_48,pool->rbn);
        lyd_insert_hash(plVar5);
      }
      rbn_00 = rb_iter_next(local_40);
      pool->rbn = rbn_00;
      plVar5 = plVar2;
    }
    LVar3 = lyds_additionally_create_rb_nodes(local_58,leader,root_meta,&local_60,plVar5);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    rbn_00 = pool->rbn;
  }
LAB_00151924:
  first_sibling = local_58;
  if (rbn_00 == (rb_node *)0x0) {
    LVar3 = rb_insert(node,&local_60,&rbn);
    if (LVar3 != LY_SUCCESS) {
      return LY_EMEM;
    }
  }
  else {
    rbn_00->right = (rb_node *)0x0;
    rbn_00->dnode = (lyd_node *)0x0;
    rbn_00->parent = (rb_node *)0x0;
    rbn_00->left = (rb_node *)0x0;
    *(undefined8 *)&rbn_00->color = 0;
    rbn_00->dnode = node;
    rbn = rbn_00;
    rb_insert_node(&local_60,rbn_00,(ly_bool *)0x0);
    prVar4 = rb_iter_next(&pool->iter_state);
    pool->rbn = prVar4;
  }
  lyds_link_data_node(first_sibling,leader,node,root_meta,rbn);
  if (local_60 != (rb_node *)0x0) {
    (root_meta->value).field_2.dec64 = (int64_t)local_60;
  }
LAB_001519a3:
  lyd_insert_hash(node);
  if (node->prev->next != (lyd_node *)0x0) {
    node = *first_sibling;
  }
  *first_sibling = node;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyds_insert2(struct lyd_node *parent, struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_node *node, struct lyds_pool *pool)
{
    LY_ERR ret;
    struct rb_node *rbt = NULL, *rbn;
    struct lyd_node *ld, *next;
    struct lyd_meta *root_meta;

    assert(pool && pool->rbn && first_sibling && node);

    if (!*leader || ((*leader)->schema != node->schema)) {
        /* leader has not been visited yet */
        ld = NULL;
        lyd_find_sibling_schema(*first_sibling, node->schema, &ld);
        if (!ld) {
            /* the destination has no (leaf-)list instance yet. */
            lyd_insert_node_ordby_schema(parent, first_sibling, node);
            *leader = node;
            goto cleanup;
        } else {
            /* leader has been found */
            *leader = ld;
        }
    }

    /* get Red-black tree from leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);
    if (!root_meta) {
        /* leader needs metadata */
        root_meta = lyds_pool_get_meta(pool);
        if (!root_meta) {
            /* there is no free structure for metadata, a new one must be allocated */
            ret = lyds_create_metadata(*leader, &root_meta);
            LY_CHECK_RET(ret);
        } else {
            /* reuse metadata */
            lyd_insert_meta(*leader, root_meta, 0);
        }
    }
    if (!rbt) {
        /* Red-black tree needed */
        lyds_additionally_reuse_rb_tree(first_sibling, leader, root_meta, &rbt, pool, &next);
        if (next) {
            /* there is no free structure for red-black node, a new ones must be allocated */
            ret = lyds_additionally_create_rb_nodes(first_sibling, leader, root_meta, &rbt, next);
            LY_CHECK_RET(ret);
        }
    }

    /* insert @p node */
    if (pool->rbn) {
        /* reuse free red-black node and insert */
        rbn = pool->rbn;
        RBN_RESET(rbn, node);
        rb_insert_node(&rbt, rbn, NULL);
        /* prepare for the next node */
        pool->rbn = rb_iter_next(&pool->iter_state);
    } else {
        /* allocate new node and insert */
        ret = rb_insert(node, &rbt, &rbn);
        LY_CHECK_RET(ret);
    }
    /* connect @p node with siblings so that the order is maintained */
    lyds_link_data_node(first_sibling, leader, node, root_meta, rbn);

cleanup:
    if (rbt) {
        RBT_SET(root_meta, rbt);
    }
    lyd_insert_hash(node);
    *first_sibling = node->prev->next ? *first_sibling : node;

    return LY_SUCCESS;
}